

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.h
# Opt level: O0

void __thiscall
oout::NamedTest::NamedTest<oout::ContainMatch,oout::ContainMatch>
          (NamedTest *this,string *name,shared_ptr<const_oout::Text> *text,
          shared_ptr<const_oout::Match> *match,shared_ptr<oout::ContainMatch> *matches,
          shared_ptr<oout::ContainMatch> *matches_1)

{
  shared_ptr<const_oout::MatchTest> local_58;
  shared_ptr<const_oout::Test> local_48;
  shared_ptr<oout::ContainMatch> *local_38;
  shared_ptr<oout::ContainMatch> *matches_local_1;
  shared_ptr<oout::ContainMatch> *matches_local;
  shared_ptr<const_oout::Match> *match_local;
  shared_ptr<const_oout::Text> *text_local;
  string *name_local;
  NamedTest *this_local;
  
  local_38 = matches_1;
  matches_local_1 = matches;
  matches_local = (shared_ptr<oout::ContainMatch> *)match;
  match_local = (shared_ptr<const_oout::Match> *)text;
  text_local = (shared_ptr<const_oout::Text> *)name;
  name_local = (string *)this;
  std::
  make_shared<oout::MatchTest_const,std::shared_ptr<oout::Text_const>const&,std::shared_ptr<oout::Match_const>const&,std::shared_ptr<oout::ContainMatch>const&,std::shared_ptr<oout::ContainMatch>const&>
            ((shared_ptr<const_oout::Text> *)&local_58,(shared_ptr<const_oout::Match> *)text,
             (shared_ptr<oout::ContainMatch> *)match,matches);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::MatchTest_const,void>
            ((shared_ptr<oout::Test_const> *)&local_48,&local_58);
  NamedTest(this,name,&local_48);
  std::shared_ptr<const_oout::Test>::~shared_ptr(&local_48);
  std::shared_ptr<const_oout::MatchTest>::~shared_ptr(&local_58);
  return;
}

Assistant:

NamedTest(
		const std::string &name,
		const std::shared_ptr<const Text> &text,
		const std::shared_ptr<const Match> &match,
		const std::shared_ptr<T> & ... matches
	) : NamedTest(name, std::make_shared<const MatchTest>(text, match, matches...))
	{
	}